

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O0

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  console_output_func p_Var1;
  uint uVar2;
  eConsoleMessageType eVar3;
  bool bVar4;
  uint uVar5;
  int extraout_EAX;
  console_func *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  dynamic_string tmp_buf;
  uint n;
  char *pPrefix;
  uint i;
  bool handled;
  char buf [4096];
  scoped_mutex lock;
  mutex *in_stack_ffffffffffffef38;
  dynamic_string *in_stack_ffffffffffffef40;
  data_stream *this_00;
  bool local_10a2;
  bool local_10a1;
  dynamic_string *in_stack_ffffffffffffef80;
  dynamic_string local_1060;
  int local_104c;
  char *local_1048;
  uint local_1040;
  byte local_1029;
  char local_1028 [4112];
  __gnuc_va_list local_18;
  char *local_10;
  eConsoleMessageType local_4;
  
  local_4 = (eConsoleMessageType)this;
  local_18 = __arg;
  local_10 = __format;
  init((EVP_PKEY_CTX *)this);
  scoped_mutex::scoped_mutex((scoped_mutex *)in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
  *(int *)(m_num_messages + (ulong)local_4 * 4) = *(int *)(m_num_messages + (ulong)local_4 * 4) + 1;
  vsnprintf(local_1028,0x1000,local_10,local_18);
  local_1029 = 0;
  uVar5 = vector<crnlib::console::console_func>::size
                    ((vector<crnlib::console::console_func> *)m_output_funcs);
  if (uVar5 != 0) {
    for (local_1040 = 0; uVar2 = local_1040,
        uVar5 = vector<crnlib::console::console_func>::size
                          ((vector<crnlib::console::console_func> *)m_output_funcs), uVar2 < uVar5;
        local_1040 = local_1040 + 1) {
      pcVar6 = vector<crnlib::console::console_func>::operator[]
                         ((vector<crnlib::console::console_func> *)m_output_funcs,local_1040);
      eVar3 = local_4;
      p_Var1 = pcVar6->m_func;
      in_stack_ffffffffffffef80 =
           (dynamic_string *)
           vector<crnlib::console::console_func>::operator[]
                     ((vector<crnlib::console::console_func> *)m_output_funcs,local_1040);
      bVar4 = (*p_Var1)(eVar3,local_1028,in_stack_ffffffffffffef80->m_pStr);
      if (bVar4) {
        local_1029 = 1;
      }
    }
  }
  local_1048 = (char *)0x0;
  if (((m_prefixes & 1) != 0) && ((m_at_beginning_of_line & 1) != 0)) {
    if (local_4 == cDebugConsoleMessage) {
      local_1048 = "Debug: ";
    }
    else if (local_4 == cWarningConsoleMessage) {
      local_1048 = "Warning: ";
    }
    else if (local_4 == cErrorConsoleMessage) {
      local_1048 = "Error: ";
    }
  }
  if (((m_output_disabled & 1) == 0) && ((local_1029 & 1) == 0)) {
    if (local_1048 != (char *)0x0) {
      ::printf("%s",local_1048);
    }
    pcVar9 = "%s";
    if ((m_crlf & 1) != 0) {
      pcVar9 = "%s\n";
    }
    ::printf(pcVar9,local_1028);
  }
  sVar7 = strlen(local_1028);
  local_104c = (int)sVar7;
  local_10a1 = true;
  if ((m_crlf & 1) == 0) {
    local_10a2 = false;
    if (local_104c != 0) {
      local_10a2 = local_1028[local_104c - 1] == '\n';
    }
    local_10a1 = local_10a2;
  }
  m_at_beginning_of_line = local_10a1;
  if ((local_4 != cProgressConsoleMessage) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38);
    dynamic_string::translate_lf_to_crlf(in_stack_ffffffffffffef80);
    pcVar9 = "%s";
    if ((m_crlf & 1) != 0) {
      pcVar9 = "%s\r\n";
    }
    this_00 = m_pLog_stream;
    pcVar8 = dynamic_string::get_ptr(&local_1060);
    data_stream::printf(this_00,pcVar9,pcVar8);
    (*m_pLog_stream->_vptr_data_stream[7])();
    dynamic_string::~dynamic_string((dynamic_string *)this_00);
  }
  scoped_mutex::~scoped_mutex((scoped_mutex *)0x11b31b);
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_num_messages[type]++;

  char buf[cConsoleBufSize];
  crnlib_vsnprintf(buf, cConsoleBufSize, p, args);

  bool handled = false;

  if (m_output_funcs.size()) {
    for (uint i = 0; i < m_output_funcs.size(); i++)
      if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
        handled = true;
  }

  const char* pPrefix = NULL;
  if ((m_prefixes) && (m_at_beginning_of_line)) {
    switch (type) {
      case cDebugConsoleMessage:
        pPrefix = "Debug: ";
        break;
      case cWarningConsoleMessage:
        pPrefix = "Warning: ";
        break;
      case cErrorConsoleMessage:
        pPrefix = "Error: ";
        break;
      default:
        break;
    }
  }

  if ((!m_output_disabled) && (!handled)) {
    if (pPrefix)
      ::printf("%s", pPrefix);
    ::printf(m_crlf ? "%s\n" : "%s", buf);
  }

  uint n = strlen(buf);
  m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

  if ((type != cProgressConsoleMessage) && (m_pLog_stream)) {
    // Yes this is bad.
    dynamic_string tmp_buf(buf);

    tmp_buf.translate_lf_to_crlf();

    m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
    m_pLog_stream->flush();
  }
}